

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::printMessage
          (Comparator<Corrade::TestSuite::Compare::File> *this,ComparisonStatusFlags param_1,
          Debug *out,char *actual,char *expected)

{
  char cVar1;
  char cVar2;
  State *pSVar3;
  Debug *pDVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  String local_e0;
  String local_c8;
  BasicStringView<const_char> local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  BasicStringView<const_char> local_90;
  undefined8 local_80;
  undefined8 local_78;
  BasicStringView<const_char> local_70;
  undefined8 local_60;
  undefined8 local_58;
  BasicStringView<const_char> local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  if (pSVar3->actualResult != Success) {
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Actual file");
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,actual);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_50,"(",(StringViewFlags)0x0);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    _ZN7Corrade10Containers15BasicStringViewIKcEC1IS2_TnNSt9enable_ifIXsr3std8is_constIT_EE5valueEiE4typeELi0EEERKNS0_6StringE
              (&local_60,&pSVar3->actualFilename);
    Corrade::Containers::operator+
              (&local_c8,local_50._data,local_50._sizePlusFlags,local_60,local_58);
    Containers::BasicStringView<char_const>::
    BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
              ((BasicStringView<char_const> *)&local_40,&local_c8,(StringViewFlags)0x0);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_70,")",(StringViewFlags)0x0);
    Corrade::Containers::operator+
              (&local_e0,local_40,local_38,local_70._data,local_70._sizePlusFlags);
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,&local_e0);
    Corrade::Utility::Debug::operator<<(pDVar4,"cannot be read.");
LAB_001126b3:
    Corrade::Containers::String::~String(&local_e0);
    Corrade::Containers::String::~String(&local_c8);
    return;
  }
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  if (pSVar3->expectedResult != Success) {
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Expected file");
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,expected);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_90,"(",(StringViewFlags)0x0);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    _ZN7Corrade10Containers15BasicStringViewIKcEC1IS2_TnNSt9enable_ifIXsr3std8is_constIT_EE5valueEiE4typeELi0EEERKNS0_6StringE
              (&local_a0,&pSVar3->expectedFilename);
    Corrade::Containers::operator+
              (&local_c8,local_90._data,local_90._sizePlusFlags,local_a0,local_98);
    Containers::BasicStringView<char_const>::
    BasicStringView<Corrade::Containers::String,Corrade::Containers::ArrayView<char_const>>
              ((BasicStringView<char_const> *)&local_80,&local_c8,(StringViewFlags)0x0);
    Containers::BasicStringView<const_char>::BasicStringView<const_char_*,_0>
              (&local_b0,")",(StringViewFlags)0x0);
    Corrade::Containers::operator+
              (&local_e0,local_80,local_78,local_b0._data,local_b0._sizePlusFlags);
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,&local_e0);
    Corrade::Utility::Debug::operator<<(pDVar4,"cannot be read.");
    goto LAB_001126b3;
  }
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Files");
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,actual);
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"and");
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,expected);
  Corrade::Utility::Debug::operator<<(pDVar4,"have different");
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  lVar5 = Corrade::Containers::String::size();
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  lVar6 = Corrade::Containers::String::size();
  if (lVar5 == lVar6) {
    pcVar11 = "contents.";
    pDVar4 = out;
  }
  else {
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"size, actual");
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    uVar8 = Corrade::Containers::String::size();
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar8);
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"but");
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    uVar8 = Corrade::Containers::String::size();
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar8);
    pcVar11 = "expected.";
  }
  Corrade::Utility::Debug::operator<<(pDVar4,pcVar11);
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  uVar7 = Corrade::Containers::String::size();
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  uVar8 = Corrade::Containers::String::size();
  if (uVar8 < uVar7) {
    uVar8 = uVar7;
  }
  uVar7 = 0;
  while( true ) {
    if (uVar8 == uVar7) {
      return;
    }
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    uVar9 = Corrade::Containers::String::size();
    if (uVar9 <= uVar7) break;
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    uVar9 = Corrade::Containers::String::size();
    if (uVar9 <= uVar7) break;
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    cVar1 = Corrade::Containers::String::operator[]((ulong)&pSVar3->actualContents);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    cVar2 = Corrade::Containers::String::operator[]((ulong)&pSVar3->expectedContents);
    if (cVar1 != cVar2) break;
    uVar7 = uVar7 + 1;
  }
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  uVar8 = Corrade::Containers::String::size();
  if (uVar7 < uVar8) {
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    uVar8 = Corrade::Containers::String::size();
    if (uVar7 < uVar8) {
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Actual character");
      pSVar3 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      uVar10 = Corrade::Containers::String::slice((ulong)&pSVar3->actualContents,uVar7);
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar10);
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,"but");
      pSVar3 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      uVar10 = Corrade::Containers::String::slice((ulong)&pSVar3->expectedContents,uVar7);
      pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar10);
      Corrade::Utility::Debug::operator<<(pDVar4,"expected");
      goto LAB_0011296c;
    }
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Actual has character");
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    uVar10 = Corrade::Containers::String::slice((ulong)&pSVar3->actualContents,uVar7);
  }
  else {
    pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"Expected has character");
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    uVar10 = Corrade::Containers::String::slice((ulong)&pSVar3->expectedContents,uVar7);
  }
  Corrade::Utility::Debug::operator<<(pDVar4,uVar10);
LAB_0011296c:
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(out,"on position");
  pDVar4 = (Debug *)Corrade::Utility::Debug::operator<<(pDVar4,uVar7);
  pDVar4[9] = (Debug)((byte)pDVar4[9] | 4);
  Corrade::Utility::Debug::operator<<(pDVar4,".");
  return;
}

Assistant:

void Comparator<Compare::File>::printMessage(ComparisonStatusFlags, Utility::Debug& out, const char* actual, const char* expected) const {
    if(_state->actualResult != Result::Success) {
        out << "Actual file" << actual << "(" + _state->actualFilename + ")" << "cannot be read.";
        return;
    }

    if(_state->expectedResult != Result::Success) {
        out << "Expected file" << expected << "(" + _state->expectedFilename + ")" << "cannot be read.";
        return;
    }

    out << "Files" << actual << "and" << expected << "have different";
    if(_state->actualContents.size() != _state->expectedContents.size())
        out << "size, actual" << _state->actualContents.size() << "but" << _state->expectedContents.size() << "expected.";
    else
        out << "contents.";

    for(std::size_t i = 0, end = Utility::max(_state->actualContents.size(), _state->expectedContents.size()); i != end; ++i) {
        if(_state->actualContents.size() > i && _state->expectedContents.size() > i && _state->actualContents[i] == _state->expectedContents[i]) continue;

        if(_state->actualContents.size() <= i)
            out << "Expected has character" << _state->expectedContents.slice(i, i + 1);
        else if(_state->expectedContents.size() <= i)
            out << "Actual has character" << _state->actualContents.slice(i, i + 1);
        else
            out << "Actual character" << _state->actualContents.slice(i, i + 1) << "but" << _state->expectedContents.slice(i, i + 1) << "expected";

        out << "on position" << i << Utility::Debug::nospace << ".";
        break;
    }
}